

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O2

void __thiscall cmCTestLaunch::ComputeFileNames(cmCTestLaunch *this)

{
  char *pcVar1;
  cmsysMD5 *md5;
  string *psVar2;
  pointer pbVar3;
  char hash [32];
  
  pcVar1 = getenv("CTEST_LAUNCH_LOGS");
  if ((pcVar1 != (char *)0x0) && (*pcVar1 != '\0')) {
    this->Passthru = false;
    psVar2 = &this->LogDir;
    std::__cxx11::string::assign((char *)psVar2);
    cmsys::SystemTools::ConvertToUnixSlashes(psVar2);
    std::__cxx11::string::append((char *)psVar2);
    md5 = cmsysMD5_New();
    cmsysMD5_Initialize(md5);
    cmsysMD5_Append(md5,(uchar *)(this->CWD)._M_dataplus._M_p,-1);
    for (pbVar3 = (this->RealArgs).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar3 != (this->RealArgs).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar3 = pbVar3 + 1) {
      cmsysMD5_Append(md5,(uchar *)(pbVar3->_M_dataplus)._M_p,-1);
    }
    cmsysMD5_FinalizeHex(md5,hash);
    cmsysMD5_Delete(md5);
    std::__cxx11::string::assign((char *)&this->LogHash,(ulong)hash);
    psVar2 = &this->LogOut;
    std::__cxx11::string::_M_assign((string *)psVar2);
    std::__cxx11::string::append((char *)psVar2);
    std::__cxx11::string::append((string *)psVar2);
    std::__cxx11::string::append((char *)psVar2);
    psVar2 = &this->LogErr;
    std::__cxx11::string::_M_assign((string *)psVar2);
    std::__cxx11::string::append((char *)psVar2);
    std::__cxx11::string::append((string *)psVar2);
    std::__cxx11::string::append((char *)psVar2);
  }
  return;
}

Assistant:

void cmCTestLaunch::ComputeFileNames()
{
  // We just passthru the behavior of the real command unless the
  // CTEST_LAUNCH_LOGS environment variable is set.
  const char* d = getenv("CTEST_LAUNCH_LOGS");
  if(!(d && *d))
    {
    return;
    }
  this->Passthru = false;

  // The environment variable specifies the directory into which we
  // generate build logs.
  this->LogDir = d;
  cmSystemTools::ConvertToUnixSlashes(this->LogDir);
  this->LogDir += "/";

  // We hash the input command working dir and command line to obtain
  // a repeatable and (probably) unique name for log files.
  char hash[32];
  cmsysMD5* md5 = cmsysMD5_New();
  cmsysMD5_Initialize(md5);
  cmsysMD5_Append(md5, (unsigned char const*)(this->CWD.c_str()), -1);
  for(std::vector<std::string>::const_iterator ai = this->RealArgs.begin();
      ai != this->RealArgs.end(); ++ai)
    {
    cmsysMD5_Append(md5, (unsigned char const*)ai->c_str(), -1);
    }
  cmsysMD5_FinalizeHex(md5, hash);
  cmsysMD5_Delete(md5);
  this->LogHash.assign(hash, 32);

  // We store stdout and stderr in temporary log files.
  this->LogOut = this->LogDir;
  this->LogOut += "launch-";
  this->LogOut += this->LogHash;
  this->LogOut += "-out.txt";
  this->LogErr = this->LogDir;
  this->LogErr += "launch-";
  this->LogErr += this->LogHash;
  this->LogErr += "-err.txt";
}